

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O3

void __thiscall
t_perl_generator::generate_service_processor(t_perl_generator *this,t_service *tservice)

{
  int *piVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  t_service *ptVar5;
  int iVar6;
  undefined4 extraout_var;
  long *plVar7;
  ostream *poVar8;
  size_type *psVar9;
  pointer pptVar10;
  string extends_processor;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_188;
  string local_168;
  string local_148;
  char *local_128;
  long local_120;
  char local_118 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<t_function_*,_std::allocator<t_function_*>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_e8,&tservice->functions_);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  ptVar5 = tservice->extends_;
  if (ptVar5 != (t_service *)0x0) {
    perl_namespace_abi_cxx11_(&local_168,this,(ptVar5->super_t_type).program_);
    iVar6 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar5);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_168,*(ulong *)CONCAT44(extraout_var,iVar6));
    paVar3 = &local_188.field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_188.field_2._M_allocated_capacity = *psVar9;
      local_188.field_2._8_8_ = plVar7[3];
      local_188._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar9;
      local_188._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_188._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    std::operator+(&local_168,"use base qw(",&local_108);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_188.field_2._M_allocated_capacity = *psVar9;
      local_188.field_2._8_8_ = plVar7[3];
      local_188._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar9;
      local_188._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_188._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = &this->f_service_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"package ",8);
  perl_namespace_abi_cxx11_
            (&local_188,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Processor;",10);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"use strict;",0xb);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_128,local_120);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar3 = &local_188.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_108._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"sub new {",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"my ($classname, $handler) = @_;",0x1f);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_168._M_dataplus._M_p,local_168._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"my $self      = {};",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"$self->{handler} = $handler;",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"return bless ($self, $classname);",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"}",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"sub process {",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"my ($self, $input, $output) = @_;",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"my $rseqid = 0;",0xf);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"my $fname  = undef;",0x13);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_148._M_dataplus._M_p,local_148._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"my $mtype  = 0;",0xf);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  paVar4 = &local_168.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar4) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"$input->readMessageBegin(\\$fname, \\$mtype, \\$rseqid);",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"my $methodname = \'process_\'.$fname;",0x23);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (!$self->can($methodname)) {",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar4) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"$input->skip(Thrift::TType::STRUCT);",0x24);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"$input->readMessageEnd();",0x19);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_148._M_dataplus._M_p,local_148._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "my $x = Thrift::TApplicationException->new(\'Function \'.$fname.\' not implemented.\', Thrift::TApplicationException::UNKNOWN_METHOD);"
             ,0x82);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"$output->writeMessageBegin($fname, Thrift::TMessageType::EXCEPTION, $rseqid);",
             0x4d);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"$x->write($output);",0x13);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"$output->writeMessageEnd();",0x1b);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"$output->getTransport()->flush();",0x21);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar4) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"$self->$methodname($rseqid, $input, $output);",0x2d);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_148._M_dataplus._M_p,local_148._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return 1;",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar4) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  for (pptVar10 = local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pptVar10 !=
      local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar10 = pptVar10 + 1) {
    generate_process_function(this,tservice,*pptVar10);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_perl_generator::generate_service_processor(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_processor = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends = perl_namespace(extends_s->get_program()) + extends_s->get_name();
    extends_processor = "use base qw(" + extends + "Processor);";
  }

  indent_up();

  // Generate the header portion
  f_service_ << "package " << perl_namespace(program_) << service_name_ << "Processor;" << endl
             << endl << "use strict;" << endl << extends_processor << endl << endl;

  if (extends.empty()) {
    f_service_ << "sub new {" << endl;

    indent_up();

    f_service_ << indent() << "my ($classname, $handler) = @_;" << endl << indent()
               << "my $self      = {};" << endl;

    f_service_ << indent() << "$self->{handler} = $handler;" << endl;

    f_service_ << indent() << "return bless ($self, $classname);" << endl;

    indent_down();

    f_service_ << "}" << endl << endl;
  }

  // Generate the server implementation
  f_service_ << "sub process {" << endl;
  indent_up();

  f_service_ << indent() << "my ($self, $input, $output) = @_;" << endl;

  f_service_ << indent() << "my $rseqid = 0;" << endl << indent() << "my $fname  = undef;" << endl
             << indent() << "my $mtype  = 0;" << endl << endl;

  f_service_ << indent() << "$input->readMessageBegin(\\$fname, \\$mtype, \\$rseqid);" << endl;

  // HOT: check for method implementation
  f_service_ << indent() << "my $methodname = 'process_'.$fname;" << endl << indent()
             << "if (!$self->can($methodname)) {" << endl;
  indent_up();

  f_service_ << indent() << "$input->skip(Thrift::TType::STRUCT);" << endl << indent()
             << "$input->readMessageEnd();" << endl << indent()
             << "my $x = Thrift::TApplicationException->new('Function '.$fname.' not implemented.', "
                "Thrift::TApplicationException::UNKNOWN_METHOD);" << endl << indent()
             << "$output->writeMessageBegin($fname, Thrift::TMessageType::EXCEPTION, $rseqid);" << endl
             << indent() << "$x->write($output);" << endl << indent()
             << "$output->writeMessageEnd();" << endl << indent()
             << "$output->getTransport()->flush();" << endl << indent() << "return;" << endl;

  indent_down();
  f_service_ << indent() << "}" << endl << indent()
             << "$self->$methodname($rseqid, $input, $output);" << endl << indent() << "return 1;"
             << endl;

  indent_down();

  f_service_ << "}" << endl << endl;

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }
}